

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cookie.c
# Opt level: O3

Cookie * Curl_cookie_add(Curl_easy *data,CookieInfo *c,_Bool httpheader,_Bool noexpire,char *lineptr
                        ,char *domain,char *path)

{
  char cVar1;
  char cVar2;
  bool bVar3;
  _Bool _Var4;
  int iVar5;
  CURLofft CVar6;
  Cookie *pCVar7;
  size_t sVar8;
  char *pcVar9;
  size_t sVar10;
  char *pcVar11;
  size_t sVar12;
  Cookie *pCVar13;
  time_t tVar14;
  long lVar15;
  uint uVar16;
  curl_off_t *num;
  Cookie *pCVar17;
  Cookie *pCVar18;
  char *pcVar19;
  bool bVar20;
  bool bVar21;
  byte bVar22;
  char *local_2068;
  undefined8 local_2040;
  char what [4096];
  char name [4096];
  
  bVar22 = 0;
  local_2040 = time((time_t *)0x0);
  pCVar7 = (Cookie *)(*Curl_ccalloc)(1,0x60);
  if (pCVar7 == (Cookie *)0x0) {
    return (Cookie *)0x0;
  }
  if (httpheader) {
    sVar8 = strlen(lineptr);
    if (5000 < sVar8) {
LAB_0044592d:
      (*Curl_cfree)(pCVar7);
      return (Cookie *)0x0;
    }
    pcVar9 = strchr(lineptr,0x3b);
    for (; (*lineptr == '\t' || (*lineptr == ' ')); lineptr = lineptr + 1) {
    }
    local_2068 = domain;
    bVar21 = false;
LAB_00445954:
    what[0] = '\0';
    name._0_8_ = name._0_8_ & 0xffffffffffffff00;
    iVar5 = __isoc99_sscanf(lineptr,"%4095[^;\r\n=] =%4095[^;\r\n]",name,what);
    if (iVar5 < 1) {
LAB_00445b23:
      bVar3 = bVar21;
      if ((pcVar9 == (char *)0x0) || (lineptr = pcVar9, *pcVar9 == '\0')) goto LAB_00445fe5;
      do {
        do {
          lineptr = lineptr + 1;
          cVar1 = *lineptr;
        } while (cVar1 == ' ');
      } while (cVar1 == '\t');
      pcVar9 = strchr(lineptr,0x3b);
      bVar21 = bVar3;
      if (pcVar9 == (char *)0x0) {
        if (cVar1 == '\0') goto LAB_00445fe5;
        sVar8 = strlen(lineptr);
        pcVar9 = lineptr + sVar8;
      }
      goto LAB_00445954;
    }
    sVar8 = strlen(what);
    sVar10 = strlen(name);
    if (((0xffe < sVar10) || (0xffe < sVar8)) || (0x1000 < sVar10 + sVar8)) {
      freecookie(pCVar7);
      Curl_infof(data,"oversized cookie dropped, name/val %zu + %zu bytes\n",sVar10,sVar8);
      return (Cookie *)0x0;
    }
    cVar1 = lineptr[sVar10];
    if ((sVar10 != 0) && ((cVar2 = lineptr[sVar10 - 1], cVar2 == ' ' || (cVar2 == '\t')))) {
LAB_004459d8:
      if (cVar2 != ' ') {
        if (((cVar2 == '\0') || (cVar2 != '\t')) || (sVar10 == 0)) goto LAB_004459ff;
LAB_004459f3:
        cVar2 = lineptr[sVar10 - 2];
        sVar10 = sVar10 - 1;
        goto LAB_004459d8;
      }
      if (sVar10 != 0) goto LAB_004459f3;
      sVar10 = 0;
LAB_004459ff:
      name[sVar10] = '\0';
    }
    bVar3 = true;
    for (; sVar8 != 0; sVar8 = sVar8 - 1) {
      if ((what[sVar8 - 1] != ' ') && (what[sVar8 - 1] != '\t')) {
        bVar3 = false;
        break;
      }
      what[sVar8 - 1] = '\0';
    }
    for (pcVar19 = what; (*pcVar19 == ' ' || (*pcVar19 == '\t')); pcVar19 = pcVar19 + 1) {
    }
    if (pCVar7->name == (char *)0x0) {
      bVar3 = true;
      if (cVar1 != '=') goto LAB_00445fe5;
      pcVar11 = (*Curl_cstrdup)(name);
      pCVar7->name = pcVar11;
      pcVar19 = (*Curl_cstrdup)(pcVar19);
      pCVar7->value = pcVar19;
      if (pCVar7->name == (char *)0x0) goto LAB_00445fe5;
LAB_00445b1a:
      bVar3 = true;
      if (pcVar19 == (char *)0x0) goto LAB_00445fe5;
      goto LAB_00445b23;
    }
    if (bVar3) {
      iVar5 = Curl_strcasecompare("secure",name);
      if (iVar5 == 0) {
        iVar5 = Curl_strcasecompare("httponly",name);
        if (iVar5 == 0) {
          if (cVar1 == '=') goto LAB_00445ac7;
        }
        else {
          pCVar7->httponly = true;
        }
      }
      else {
        pCVar7->secure = true;
      }
      goto LAB_00445b23;
    }
LAB_00445ac7:
    iVar5 = Curl_strcasecompare("path",name);
    if (iVar5 != 0) {
      (*Curl_cfree)(pCVar7->path);
      pcVar19 = (*Curl_cstrdup)(pcVar19);
      pCVar7->path = pcVar19;
      bVar3 = true;
      if (pcVar19 != (char *)0x0) {
        (*Curl_cfree)(pCVar7->spath);
        pcVar19 = sanitize_cookie_path(pCVar7->path);
        pCVar7->spath = pcVar19;
        goto LAB_00445b1a;
      }
      goto LAB_00445fe5;
    }
    iVar5 = Curl_strcasecompare("domain",name);
    if (iVar5 != 0) {
      pcVar19 = pcVar19 + (*pcVar19 == '.');
      pcVar11 = strchr(pcVar19,0x2e);
      if ((pcVar11 == (char *)0x0) && (iVar5 = Curl_strcasecompare(pcVar19,"localhost"), iVar5 == 0)
         ) {
        bVar3 = isip(":");
        local_2068 = ":";
joined_r0x00445bf2:
        if (bVar3) {
          iVar5 = strcmp(pcVar19,local_2068);
          if (iVar5 == 0) {
            bVar3 = true;
            goto LAB_00445cc0;
          }
        }
        else {
          _Var4 = tailmatch(pcVar19,local_2068);
          if (_Var4) {
            bVar3 = false;
            goto LAB_00445cc0;
          }
        }
        Curl_infof(data,"skipped cookie with bad tailmatch domain: %s\n",pcVar19);
        bVar21 = true;
      }
      else {
        pcVar11 = local_2068;
        if (local_2068 == (char *)0x0) {
          pcVar11 = pcVar19;
        }
        bVar3 = isip(pcVar11);
        if (local_2068 != (char *)0x0) goto joined_r0x00445bf2;
        local_2068 = (char *)0x0;
LAB_00445cc0:
        (*Curl_cfree)(pCVar7->domain);
        pcVar19 = (*Curl_cstrdup)(pcVar19);
        pCVar7->domain = pcVar19;
        if ((pcVar19 == (char *)0x0) || (bVar3 != false)) goto LAB_00445d46;
        pCVar7->tailmatch = true;
      }
      goto LAB_00445b23;
    }
    iVar5 = Curl_strcasecompare("version",name);
    if (iVar5 == 0) {
      iVar5 = Curl_strcasecompare("max-age",name);
      if (iVar5 != 0) {
        (*Curl_cfree)(pCVar7->maxage);
        pcVar19 = (*Curl_cstrdup)(pcVar19);
        pCVar7->maxage = pcVar19;
        if (pcVar19 != (char *)0x0) goto LAB_00445b23;
        bVar3 = true;
        goto LAB_004463b0;
      }
      iVar5 = Curl_strcasecompare("expires",name);
      if (iVar5 != 0) {
        (*Curl_cfree)(pCVar7->expirestr);
        pcVar19 = (*Curl_cstrdup)(pcVar19);
        pCVar7->expirestr = pcVar19;
        goto LAB_00445d46;
      }
      goto LAB_00445b23;
    }
    (*Curl_cfree)(pCVar7->version);
    pcVar19 = (*Curl_cstrdup)(pcVar19);
    pCVar7->version = pcVar19;
LAB_00445d46:
    if (pcVar19 != (char *)0x0) goto LAB_00445b23;
    bVar3 = true;
LAB_00445fe5:
    pcVar9 = pCVar7->maxage;
    if (pcVar9 == (char *)0x0) {
LAB_004463b0:
      if (pCVar7->expirestr != (char *)0x0) {
        tVar14 = curl_getdate(pCVar7->expirestr,(time_t *)0x0);
        pCVar7->expires = tVar14;
        if (tVar14 == 0) {
          pCVar7->expires = 1;
        }
        else if (tVar14 < 0) {
          pCVar7->expires = 0;
        }
      }
    }
    else {
      num = &pCVar7->expires;
      CVar6 = curlx_strtoofft(pcVar9 + (*pcVar9 == '\"'),(char **)0x0,10,num);
      if (CVar6 == CURL_OFFT_OK) {
        if (0x7fffffffffffffff - local_2040 < *num) goto LAB_00446071;
        *num = *num + local_2040;
      }
      else if (CVar6 == CURL_OFFT_FLOW) {
LAB_00446071:
        *num = 0x7fffffffffffffff;
      }
    }
    bVar21 = bVar3;
    if (((!bVar3) && (pCVar7->domain == (char *)0x0)) && (local_2068 != (char *)0x0)) {
      pcVar9 = (*Curl_cstrdup)(local_2068);
      pCVar7->domain = pcVar9;
      bVar21 = true;
      if (pcVar9 != (char *)0x0) {
        bVar21 = bVar3;
      }
    }
    if (((!bVar21) && (path != (char *)0x0)) && (pCVar7->path == (char *)0x0)) {
      pcVar9 = strchr(path,0x3f);
      if (pcVar9 == (char *)0x0) {
        pcVar9 = strrchr(path,0x2f);
      }
      else {
        pcVar9 = (char *)Curl_memrchr(path,0x2f,(long)pcVar9 - (long)path);
      }
      if (pcVar9 != (char *)0x0) {
        pcVar19 = (char *)(*Curl_cmalloc)((size_t)(pcVar9 + (2 - (long)path)));
        pCVar7->path = pcVar19;
        if (pcVar19 == (char *)0x0) goto LAB_0044630a;
        memcpy(pcVar19,path,(size_t)(pcVar9 + (1 - (long)path)));
        pCVar7->path[(long)(pcVar9 + (1 - (long)path))] = '\0';
        pcVar9 = sanitize_cookie_path(pCVar7->path);
        pCVar7->spath = pcVar9;
        bVar21 = pcVar9 == (char *)0x0;
      }
    }
    if ((bVar21) || (pCVar7->name == (char *)0x0)) goto LAB_0044630a;
  }
  else {
    name[0] = '\0';
    name[1] = '\0';
    name[2] = '\0';
    name[3] = '\0';
    name[4] = '\0';
    name[5] = '\0';
    name[6] = '\0';
    name[7] = '\0';
    iVar5 = strncmp(lineptr,"#HttpOnly_",10);
    if (iVar5 == 0) {
      lineptr = lineptr + 10;
      pCVar7->httponly = true;
    }
    if (*lineptr == '#') goto LAB_0044592d;
    pcVar9 = strchr(lineptr,0xd);
    if (pcVar9 != (char *)0x0) {
      *pcVar9 = '\0';
    }
    pcVar9 = strchr(lineptr,10);
    if (pcVar9 != (char *)0x0) {
      *pcVar9 = '\0';
    }
    pcVar9 = strtok_r(lineptr,"\t",(char **)name);
    if (pcVar9 == (char *)0x0) goto LAB_0044630a;
    uVar16 = 0;
    bVar21 = false;
    do {
      switch(uVar16) {
      case 0:
        pcVar9 = (*Curl_cstrdup)(pcVar9 + (*pcVar9 == '.'));
        pCVar7->domain = pcVar9;
        if (pcVar9 == (char *)0x0) {
          bVar21 = true;
        }
        uVar16 = 0;
        break;
      case 1:
        iVar5 = Curl_strcasecompare(pcVar9,"TRUE");
        pCVar7->tailmatch = iVar5 != 0;
        uVar16 = 1;
        break;
      case 2:
        iVar5 = strcmp("TRUE",pcVar9);
        if ((iVar5 == 0) || (iVar5 = strcmp("FALSE",pcVar9), iVar5 == 0)) {
          pcVar19 = (*Curl_cstrdup)("/");
          pCVar7->path = pcVar19;
          pcVar11 = (*Curl_cstrdup)("/");
          if (pcVar19 == (char *)0x0) {
            bVar21 = true;
          }
          pCVar7->spath = pcVar11;
          if (pcVar11 == (char *)0x0) {
            bVar21 = true;
          }
          goto switchD_00445ddf_caseD_3;
        }
        pcVar9 = (*Curl_cstrdup)(pcVar9);
        pCVar7->path = pcVar9;
        uVar16 = 2;
        if (pcVar9 == (char *)0x0) {
          bVar21 = true;
        }
        else {
          pcVar9 = sanitize_cookie_path(pcVar9);
          pCVar7->spath = pcVar9;
          if (pcVar9 == (char *)0x0) {
            bVar21 = true;
          }
        }
        break;
      case 3:
switchD_00445ddf_caseD_3:
        iVar5 = Curl_strcasecompare(pcVar9,"TRUE");
        pCVar7->secure = iVar5 != 0;
        uVar16 = 3;
        break;
      case 4:
        CVar6 = curlx_strtoofft(pcVar9,(char **)0x0,10,&pCVar7->expires);
        if (CVar6 != CURL_OFFT_OK) {
          bVar21 = true;
        }
        uVar16 = 4;
        break;
      case 5:
        pcVar9 = (*Curl_cstrdup)(pcVar9);
        pCVar7->name = pcVar9;
        if (pcVar9 == (char *)0x0) {
          bVar21 = true;
        }
        uVar16 = 5;
        break;
      case 6:
        pcVar9 = (*Curl_cstrdup)(pcVar9);
        pCVar7->value = pcVar9;
        if (pcVar9 == (char *)0x0) {
          bVar21 = true;
        }
        uVar16 = 6;
      }
      pcVar9 = strtok_r((char *)0x0,"\t",(char **)name);
      uVar16 = uVar16 + 1;
    } while ((pcVar9 != (char *)0x0) && (!bVar21));
    if (uVar16 == 6) {
      pcVar9 = (*Curl_cstrdup)("");
      pCVar7->value = pcVar9;
      bVar3 = true;
      if (pcVar9 != (char *)0x0) {
        bVar3 = bVar21;
      }
      bVar21 = bVar3;
      uVar16 = pcVar9 == (char *)0x0 ^ 7;
    }
    if ((bVar21) || (uVar16 != 7)) goto LAB_0044630a;
  }
  if ((c->running != false) || ((c->newsession != true || (pCVar7->expires != 0)))) {
    pCVar7->livecookie = c->running;
    iVar5 = c->lastct + 1;
    c->lastct = iVar5;
    pCVar7->creationtime = iVar5;
    if (!noexpire) {
      remove_expired(c);
    }
    sVar12 = cookiehash(pCVar7->domain);
    bVar3 = false;
    bVar21 = false;
    if (c->cookies[sVar12] == (Cookie *)0x0) {
      pCVar18 = (Cookie *)0x0;
    }
    else {
      pCVar13 = c->cookies[sVar12];
      do {
        pCVar18 = pCVar13;
        iVar5 = Curl_strcasecompare(pCVar18->name,pCVar7->name);
        if (iVar5 != 0) {
          pcVar9 = pCVar7->domain;
          if (pCVar18->domain == (char *)0x0) {
            bVar20 = pcVar9 == (char *)0x0;
LAB_00446183:
            bVar21 = bVar3;
            if (bVar20) {
              bVar3 = true;
              bVar21 = true;
            }
          }
          else if ((pcVar9 != (char *)0x0) &&
                  (iVar5 = Curl_strcasecompare(pCVar18->domain,pcVar9), iVar5 != 0)) {
            bVar20 = pCVar18->tailmatch == pCVar7->tailmatch;
            goto LAB_00446183;
          }
          if (bVar21) {
            pcVar9 = pCVar7->spath;
            if (pCVar18->spath == (char *)0x0) {
              if (pcVar9 != (char *)0x0) {
LAB_004461ba:
                bVar3 = false;
                bVar21 = false;
                goto LAB_004461bd;
              }
            }
            else if ((pcVar9 == (char *)0x0) ||
                    (iVar5 = Curl_strcasecompare(pCVar18->spath,pcVar9), iVar5 == 0))
            goto LAB_004461ba;
            if ((pCVar7->livecookie != false) || (pCVar18->livecookie != true)) {
              pCVar7->next = pCVar18->next;
              pCVar7->creationtime = pCVar18->creationtime;
              (*Curl_cfree)(pCVar18->name);
              (*Curl_cfree)(pCVar18->value);
              (*Curl_cfree)(pCVar18->domain);
              (*Curl_cfree)(pCVar18->path);
              (*Curl_cfree)(pCVar18->spath);
              (*Curl_cfree)(pCVar18->expirestr);
              (*Curl_cfree)(pCVar18->version);
              (*Curl_cfree)(pCVar18->maxage);
              pCVar13 = pCVar7;
              pCVar17 = pCVar18;
              for (lVar15 = 0xc; lVar15 != 0; lVar15 = lVar15 + -1) {
                pCVar17->next = pCVar13->next;
                pCVar13 = (Cookie *)((long)pCVar13 + (ulong)bVar22 * -0x10 + 8);
                pCVar17 = (Cookie *)((long)pCVar17 + (ulong)bVar22 * -0x10 + 8);
              }
              (*Curl_cfree)(pCVar7);
              pCVar7 = pCVar18;
              do {
                pCVar13 = pCVar7;
                pCVar7 = pCVar13->next;
              } while (pCVar7 != (Cookie *)0x0);
              bVar21 = true;
              pCVar7 = pCVar18;
              pCVar18 = pCVar13;
              break;
            }
            goto LAB_0044630a;
          }
        }
LAB_004461bd:
        pCVar13 = pCVar18->next;
      } while (pCVar18->next != (Cookie *)0x0);
    }
    if (c->running != false) {
      pcVar9 = "Added";
      if (bVar21) {
        pcVar9 = "Replaced";
      }
      Curl_infof(data,"%s cookie %s=\"%s\" for domain %s, path %s, expire %ld\n",pcVar9,pCVar7->name
                 ,pCVar7->value,pCVar7->domain,pCVar7->path,pCVar7->expires);
    }
    if (!bVar21) {
      pCVar13 = (Cookie *)(c->cookies + sVar12);
      if (pCVar18 != (Cookie *)0x0) {
        pCVar13 = pCVar18;
      }
      pCVar13->next = pCVar7;
      c->numcookies = c->numcookies + 1;
      return pCVar7;
    }
    return pCVar7;
  }
LAB_0044630a:
  freecookie(pCVar7);
  return (Cookie *)0x0;
}

Assistant:

struct Cookie *
Curl_cookie_add(struct Curl_easy *data,
                /* The 'data' pointer here may be NULL at times, and thus
                   must only be used very carefully for things that can deal
                   with data being NULL. Such as infof() and similar */

                struct CookieInfo *c,
                bool httpheader, /* TRUE if HTTP header-style line */
                bool noexpire, /* if TRUE, skip remove_expired() */
                char *lineptr,   /* first character of the line */
                const char *domain, /* default domain */
                const char *path)   /* full path used when this cookie is set,
                                       used to get default path for the cookie
                                       unless set */
{
  struct Cookie *clist;
  struct Cookie *co;
  struct Cookie *lastc = NULL;
  time_t now = time(NULL);
  bool replace_old = FALSE;
  bool badcookie = FALSE; /* cookies are good by default. mmmmm yummy */
  size_t myhash;

#ifdef CURL_DISABLE_VERBOSE_STRINGS
  (void)data;
#endif

  /* First, alloc and init a new struct for it */
  co = calloc(1, sizeof(struct Cookie));
  if(!co)
    return NULL; /* bail out if we're this low on memory */

  if(httpheader) {
    /* This line was read off a HTTP-header */
    char name[MAX_NAME];
    char what[MAX_NAME];
    const char *ptr;
    const char *semiptr;

    size_t linelength = strlen(lineptr);
    if(linelength > MAX_COOKIE_LINE) {
      /* discard overly long lines at once */
      free(co);
      return NULL;
    }

    semiptr = strchr(lineptr, ';'); /* first, find a semicolon */

    while(*lineptr && ISBLANK(*lineptr))
      lineptr++;

    ptr = lineptr;
    do {
      /* we have a <what>=<this> pair or a stand-alone word here */
      name[0] = what[0] = 0; /* init the buffers */
      if(1 <= sscanf(ptr, "%" MAX_NAME_TXT "[^;\r\n=] =%"
                     MAX_NAME_TXT "[^;\r\n]",
                     name, what)) {
        /* Use strstore() below to properly deal with received cookie
           headers that have the same string property set more than once,
           and then we use the last one. */
        const char *whatptr;
        bool done = FALSE;
        bool sep;
        size_t len = strlen(what);
        size_t nlen = strlen(name);
        const char *endofn = &ptr[ nlen ];

        if(nlen >= (MAX_NAME-1) || len >= (MAX_NAME-1) ||
           ((nlen + len) > MAX_NAME)) {
          /* too long individual name or contents, or too long combination of
             name + contents. Chrome and Firefox support 4095 or 4096 bytes
             combo. */
          freecookie(co);
          infof(data, "oversized cookie dropped, name/val %zu + %zu bytes\n",
                nlen, len);
          return NULL;
        }

        /* name ends with a '=' ? */
        sep = (*endofn == '=')?TRUE:FALSE;

        if(nlen) {
          endofn--; /* move to the last character */
          if(ISBLANK(*endofn)) {
            /* skip trailing spaces in name */
            while(*endofn && ISBLANK(*endofn) && nlen) {
              endofn--;
              nlen--;
            }
            name[nlen] = 0; /* new end of name */
          }
        }

        /* Strip off trailing whitespace from the 'what' */
        while(len && ISBLANK(what[len-1])) {
          what[len-1] = 0;
          len--;
        }

        /* Skip leading whitespace from the 'what' */
        whatptr = what;
        while(*whatptr && ISBLANK(*whatptr))
          whatptr++;

        if(!co->name) {
          /* The very first name/value pair is the actual cookie name */
          if(!sep) {
            /* Bad name/value pair. */
            badcookie = TRUE;
            break;
          }
          co->name = strdup(name);
          co->value = strdup(whatptr);
          done = TRUE;
          if(!co->name || !co->value) {
            badcookie = TRUE;
            break;
          }
        }
        else if(!len) {
          /* this was a "<name>=" with no content, and we must allow
             'secure' and 'httponly' specified this weirdly */
          done = TRUE;
          if(strcasecompare("secure", name))
            co->secure = TRUE;
          else if(strcasecompare("httponly", name))
            co->httponly = TRUE;
          else if(sep)
            /* there was a '=' so we're not done parsing this field */
            done = FALSE;
        }
        if(done)
          ;
        else if(strcasecompare("path", name)) {
          strstore(&co->path, whatptr);
          if(!co->path) {
            badcookie = TRUE; /* out of memory bad */
            break;
          }
          free(co->spath); /* if this is set again */
          co->spath = sanitize_cookie_path(co->path);
          if(!co->spath) {
            badcookie = TRUE; /* out of memory bad */
            break;
          }
        }
        else if(strcasecompare("domain", name)) {
          bool is_ip;

          /* Now, we make sure that our host is within the given domain,
             or the given domain is not valid and thus cannot be set. */

          if('.' == whatptr[0])
            whatptr++; /* ignore preceding dot */

#ifndef USE_LIBPSL
          /*
           * Without PSL we don't know when the incoming cookie is set on a
           * TLD or otherwise "protected" suffix. To reduce risk, we require a
           * dot OR the exact host name being "localhost".
           */
          if(bad_domain(whatptr))
            domain = ":";
#endif

          is_ip = isip(domain ? domain : whatptr);

          if(!domain
             || (is_ip && !strcmp(whatptr, domain))
             || (!is_ip && tailmatch(whatptr, domain))) {
            strstore(&co->domain, whatptr);
            if(!co->domain) {
              badcookie = TRUE;
              break;
            }
            if(!is_ip)
              co->tailmatch = TRUE; /* we always do that if the domain name was
                                       given */
          }
          else {
            /* we did not get a tailmatch and then the attempted set domain
               is not a domain to which the current host belongs. Mark as
               bad. */
            badcookie = TRUE;
            infof(data, "skipped cookie with bad tailmatch domain: %s\n",
                  whatptr);
          }
        }
        else if(strcasecompare("version", name)) {
          strstore(&co->version, whatptr);
          if(!co->version) {
            badcookie = TRUE;
            break;
          }
        }
        else if(strcasecompare("max-age", name)) {
          /* Defined in RFC2109:

             Optional.  The Max-Age attribute defines the lifetime of the
             cookie, in seconds.  The delta-seconds value is a decimal non-
             negative integer.  After delta-seconds seconds elapse, the
             client should discard the cookie.  A value of zero means the
             cookie should be discarded immediately.

          */
          strstore(&co->maxage, whatptr);
          if(!co->maxage) {
            badcookie = TRUE;
            break;
          }
        }
        else if(strcasecompare("expires", name)) {
          strstore(&co->expirestr, whatptr);
          if(!co->expirestr) {
            badcookie = TRUE;
            break;
          }
        }
        /*
          else this is the second (or more) name we don't know
          about! */
      }
      else {
        /* this is an "illegal" <what>=<this> pair */
      }

      if(!semiptr || !*semiptr) {
        /* we already know there are no more cookies */
        semiptr = NULL;
        continue;
      }

      ptr = semiptr + 1;
      while(*ptr && ISBLANK(*ptr))
        ptr++;
      semiptr = strchr(ptr, ';'); /* now, find the next semicolon */

      if(!semiptr && *ptr)
        /* There are no more semicolons, but there's a final name=value pair
           coming up */
        semiptr = strchr(ptr, '\0');
    } while(semiptr);

    if(co->maxage) {
      CURLofft offt;
      offt = curlx_strtoofft((*co->maxage == '\"')?
                             &co->maxage[1]:&co->maxage[0], NULL, 10,
                             &co->expires);
      if(offt == CURL_OFFT_FLOW)
        /* overflow, used max value */
        co->expires = CURL_OFF_T_MAX;
      else if(!offt) {
        if(CURL_OFF_T_MAX - now < co->expires)
          /* would overflow */
          co->expires = CURL_OFF_T_MAX;
        else
          co->expires += now;
      }
    }
    else if(co->expirestr) {
      /* Note that if the date couldn't get parsed for whatever reason,
         the cookie will be treated as a session cookie */
      co->expires = curl_getdate(co->expirestr, NULL);

      /* Session cookies have expires set to 0 so if we get that back
         from the date parser let's add a second to make it a
         non-session cookie */
      if(co->expires == 0)
        co->expires = 1;
      else if(co->expires < 0)
        co->expires = 0;
    }

    if(!badcookie && !co->domain) {
      if(domain) {
        /* no domain was given in the header line, set the default */
        co->domain = strdup(domain);
        if(!co->domain)
          badcookie = TRUE;
      }
    }

    if(!badcookie && !co->path && path) {
      /* No path was given in the header line, set the default.
         Note that the passed-in path to this function MAY have a '?' and
         following part that MUST not be stored as part of the path. */
      char *queryp = strchr(path, '?');

      /* queryp is where the interesting part of the path ends, so now we
         want to the find the last */
      char *endslash;
      if(!queryp)
        endslash = strrchr(path, '/');
      else
        endslash = memrchr(path, '/', (queryp - path));
      if(endslash) {
        size_t pathlen = (endslash-path + 1); /* include end slash */
        co->path = malloc(pathlen + 1); /* one extra for the zero byte */
        if(co->path) {
          memcpy(co->path, path, pathlen);
          co->path[pathlen] = 0; /* zero terminate */
          co->spath = sanitize_cookie_path(co->path);
          if(!co->spath)
            badcookie = TRUE; /* out of memory bad */
        }
        else
          badcookie = TRUE;
      }
    }

    if(badcookie || !co->name) {
      /* we didn't get a cookie name or a bad one,
         this is an illegal line, bail out */
      freecookie(co);
      return NULL;
    }

  }
  else {
    /* This line is NOT a HTTP header style line, we do offer support for
       reading the odd netscape cookies-file format here */
    char *ptr;
    char *firstptr;
    char *tok_buf = NULL;
    int fields;

    /* IE introduced HTTP-only cookies to prevent XSS attacks. Cookies
       marked with httpOnly after the domain name are not accessible
       from javascripts, but since curl does not operate at javascript
       level, we include them anyway. In Firefox's cookie files, these
       lines are preceded with #HttpOnly_ and then everything is
       as usual, so we skip 10 characters of the line..
    */
    if(strncmp(lineptr, "#HttpOnly_", 10) == 0) {
      lineptr += 10;
      co->httponly = TRUE;
    }

    if(lineptr[0]=='#') {
      /* don't even try the comments */
      free(co);
      return NULL;
    }
    /* strip off the possible end-of-line characters */
    ptr = strchr(lineptr, '\r');
    if(ptr)
      *ptr = 0; /* clear it */
    ptr = strchr(lineptr, '\n');
    if(ptr)
      *ptr = 0; /* clear it */

    firstptr = strtok_r(lineptr, "\t", &tok_buf); /* tokenize it on the TAB */

    /* Now loop through the fields and init the struct we already have
       allocated */
    for(ptr = firstptr, fields = 0; ptr && !badcookie;
        ptr = strtok_r(NULL, "\t", &tok_buf), fields++) {
      switch(fields) {
      case 0:
        if(ptr[0]=='.') /* skip preceding dots */
          ptr++;
        co->domain = strdup(ptr);
        if(!co->domain)
          badcookie = TRUE;
        break;
      case 1:
        /* This field got its explanation on the 23rd of May 2001 by
           Andrés García:

           flag: A TRUE/FALSE value indicating if all machines within a given
           domain can access the variable. This value is set automatically by
           the browser, depending on the value you set for the domain.

           As far as I can see, it is set to true when the cookie says
           .domain.com and to false when the domain is complete www.domain.com
        */
        co->tailmatch = strcasecompare(ptr, "TRUE")?TRUE:FALSE;
        break;
      case 2:
        /* It turns out, that sometimes the file format allows the path
           field to remain not filled in, we try to detect this and work
           around it! Andrés García made us aware of this... */
        if(strcmp("TRUE", ptr) && strcmp("FALSE", ptr)) {
          /* only if the path doesn't look like a boolean option! */
          co->path = strdup(ptr);
          if(!co->path)
            badcookie = TRUE;
          else {
            co->spath = sanitize_cookie_path(co->path);
            if(!co->spath) {
              badcookie = TRUE; /* out of memory bad */
            }
          }
          break;
        }
        /* this doesn't look like a path, make one up! */
        co->path = strdup("/");
        if(!co->path)
          badcookie = TRUE;
        co->spath = strdup("/");
        if(!co->spath)
          badcookie = TRUE;
        fields++; /* add a field and fall down to secure */
        /* FALLTHROUGH */
      case 3:
        co->secure = strcasecompare(ptr, "TRUE")?TRUE:FALSE;
        break;
      case 4:
        if(curlx_strtoofft(ptr, NULL, 10, &co->expires))
          badcookie = TRUE;
        break;
      case 5:
        co->name = strdup(ptr);
        if(!co->name)
          badcookie = TRUE;
        break;
      case 6:
        co->value = strdup(ptr);
        if(!co->value)
          badcookie = TRUE;
        break;
      }
    }
    if(6 == fields) {
      /* we got a cookie with blank contents, fix it */
      co->value = strdup("");
      if(!co->value)
        badcookie = TRUE;
      else
        fields++;
    }

    if(!badcookie && (7 != fields))
      /* we did not find the sufficient number of fields */
      badcookie = TRUE;

    if(badcookie) {
      freecookie(co);
      return NULL;
    }

  }

  if(!c->running &&    /* read from a file */
     c->newsession &&  /* clean session cookies */
     !co->expires) {   /* this is a session cookie since it doesn't expire! */
    freecookie(co);
    return NULL;
  }

  co->livecookie = c->running;
  co->creationtime = ++c->lastct;

  /* now, we have parsed the incoming line, we must now check if this
     supersedes an already existing cookie, which it may if the previous have
     the same domain and path as this */

  /* at first, remove expired cookies */
  if(!noexpire)
    remove_expired(c);

#ifdef USE_LIBPSL
  /* Check if the domain is a Public Suffix and if yes, ignore the cookie. */
  if(domain && co->domain && !isip(co->domain)) {
    const psl_ctx_t *psl = Curl_psl_use(data);
    int acceptable;

    if(psl) {
      acceptable = psl_is_cookie_domain_acceptable(psl, domain, co->domain);
      Curl_psl_release(data);
    }
    else
      acceptable = !bad_domain(domain);

    if(!acceptable) {
      infof(data, "cookie '%s' dropped, domain '%s' must not "
                  "set cookies for '%s'\n", co->name, domain, co->domain);
      freecookie(co);
      return NULL;
    }
  }
#endif

  myhash = cookiehash(co->domain);
  clist = c->cookies[myhash];
  replace_old = FALSE;
  while(clist) {
    if(strcasecompare(clist->name, co->name)) {
      /* the names are identical */

      if(clist->domain && co->domain) {
        if(strcasecompare(clist->domain, co->domain) &&
          (clist->tailmatch == co->tailmatch))
          /* The domains are identical */
          replace_old = TRUE;
      }
      else if(!clist->domain && !co->domain)
        replace_old = TRUE;

      if(replace_old) {
        /* the domains were identical */

        if(clist->spath && co->spath) {
          if(strcasecompare(clist->spath, co->spath)) {
            replace_old = TRUE;
          }
          else
            replace_old = FALSE;
        }
        else if(!clist->spath && !co->spath)
          replace_old = TRUE;
        else
          replace_old = FALSE;

      }

      if(replace_old && !co->livecookie && clist->livecookie) {
        /* Both cookies matched fine, except that the already present
           cookie is "live", which means it was set from a header, while
           the new one isn't "live" and thus only read from a file. We let
           live cookies stay alive */

        /* Free the newcomer and get out of here! */
        freecookie(co);
        return NULL;
      }

      if(replace_old) {
        co->next = clist->next; /* get the next-pointer first */

        /* when replacing, creationtime is kept from old */
        co->creationtime = clist->creationtime;

        /* then free all the old pointers */
        free(clist->name);
        free(clist->value);
        free(clist->domain);
        free(clist->path);
        free(clist->spath);
        free(clist->expirestr);
        free(clist->version);
        free(clist->maxage);

        *clist = *co;  /* then store all the new data */

        free(co);   /* free the newly alloced memory */
        co = clist; /* point to the previous struct instead */

        /* We have replaced a cookie, now skip the rest of the list but
           make sure the 'lastc' pointer is properly set */
        do {
          lastc = clist;
          clist = clist->next;
        } while(clist);
        break;
      }
    }
    lastc = clist;
    clist = clist->next;
  }

  if(c->running)
    /* Only show this when NOT reading the cookies from a file */
    infof(data, "%s cookie %s=\"%s\" for domain %s, path %s, "
          "expire %" CURL_FORMAT_CURL_OFF_T "\n",
          replace_old?"Replaced":"Added", co->name, co->value,
          co->domain, co->path, co->expires);

  if(!replace_old) {
    /* then make the last item point on this new one */
    if(lastc)
      lastc->next = co;
    else
      c->cookies[myhash] = co;
    c->numcookies++; /* one more cookie in the jar */
  }

  return co;
}